

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O1

void __thiscall APowerInvulnerable::EndEffect(APowerInvulnerable *this)

{
  ActorFlags2 *pAVar1;
  DWORD *pDVar2;
  int iVar3;
  AActor *pAVar4;
  
  APowerup::EndEffect(&this->super_APowerup);
  pAVar4 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar4 != (AActor *)0x0) {
    if (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar1 = &((this->super_APowerup).super_AInventory.Owner.field_0.p)->flags2;
      pAVar1->Value = pAVar1->Value & 0xf7ffffff;
      pDVar2 = &((this->super_APowerup).super_AInventory.Owner.field_0.p)->effects;
      *pDVar2 = *pDVar2 & 0xffffffdf;
      iVar3 = (this->super_APowerup).Mode.super_FName.Index;
      if (iVar3 == 0x12) {
        pAVar1 = &((this->super_APowerup).super_AInventory.Owner.field_0.p)->flags2;
        pAVar1->Value = pAVar1->Value & 0x7fffffff;
      }
      else if ((iVar3 == 0x11) &&
              (pAVar1 = &((this->super_APowerup).super_AInventory.Owner.field_0.p)->flags2,
              pAVar1->Value = pAVar1->Value & 0xfbffffff,
              ((((this->super_APowerup).super_AInventory.Owner.field_0.p)->flags).Value & 0x40000)
              == 0)) {
        ((this->super_APowerup).super_AInventory.Owner.field_0.p)->RenderStyle =
             LegacyRenderStyles[1];
        ((this->super_APowerup).super_AInventory.Owner.field_0.p)->Alpha = 1.0;
      }
      if (((this->super_APowerup).super_AInventory.Owner.field_0.p)->player != (player_t *)0x0) {
        ((this->super_APowerup).super_AInventory.Owner.field_0.p)->player->fixedcolormap = -1;
      }
    }
    else {
      (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
    }
  }
  return;
}

Assistant:

void APowerInvulnerable::EndEffect ()
{
	Super::EndEffect();

	if (Owner == NULL)
	{
		return;
	}

	Owner->flags2 &= ~MF2_INVULNERABLE;
	Owner->effects &= ~FX_RESPAWNINVUL;
	if (Mode == NAME_Ghost)
	{
		Owner->flags2 &= ~MF2_NONSHOOTABLE;
		if (!(Owner->flags & MF_SHADOW))
		{
			// Don't mess with the translucency settings if an
			// invisibility powerup is active.
			Owner->RenderStyle = STYLE_Normal;
			Owner->Alpha = 1.;
		}
	}
	else if (Mode == NAME_Reflective)
	{
		Owner->flags2 &= ~MF2_REFLECTIVE;
	}

	if (Owner->player != NULL)
	{
		Owner->player->fixedcolormap = NOFIXEDCOLORMAP;
	}
}